

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

int evfilt_read_knote_disable(filter *filt,knote *kn)

{
  int iVar1;
  int iVar2;
  
  if ((kn->kn_flags & 1) == 0) {
    iVar1 = epoll_update(2,filt,kn,1,false);
    return iVar1;
  }
  iVar2 = 0;
  iVar1 = epoll_ctl(kn->kn_epollfd,2,(kn->field_10).kn_timerfd,(epoll_event *)0x0);
  if (iVar1 < 0) {
    iVar2 = -1;
  }
  else {
    kn->kn_registered = 0;
  }
  return iVar2;
}

Assistant:

int
evfilt_read_knote_disable(struct filter *filt, struct knote *kn)
{
    if (kn->kn_flags & KNFL_FILE) {
        if (epoll_ctl(kn->kn_epollfd, EPOLL_CTL_DEL, kn->kn_eventfd, NULL) < 0) {
            dbg_perror("epoll_ctl(2)");
            return (-1);
        }
        kn->kn_registered = 0;
        return (0);
    }

    return epoll_update(EPOLL_CTL_DEL, filt, kn, EPOLLIN, false);
}